

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  Scene *pSVar3;
  Ref<embree::Geometry> *pRVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  undefined1 (*pauVar23) [16];
  byte bVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined4 uVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [32];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a0 [16];
  undefined1 (*local_1390) [16];
  long local_1388;
  long local_1380;
  ulong local_1378;
  RTCFilterFunctionNArguments local_1370;
  undefined1 local_1340 [32];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [32];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float local_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  undefined1 local_1250 [16];
  undefined1 local_1240 [32];
  RTCHitN local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined4 local_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  uint uStack_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1390 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_1310 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar131 = ZEXT1664(local_1310);
  local_1320 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar132 = ZEXT1664(local_1320);
  uVar100 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1250._4_4_ = uVar100;
  local_1250._0_4_ = uVar100;
  local_1250._8_4_ = uVar100;
  local_1250._12_4_ = uVar100;
  auVar102 = ZEXT1664(local_1250);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar121 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar103 = fVar116 * 0.99999964;
  fVar108 = fVar121 * 0.99999964;
  fVar112 = fVar126 * 0.99999964;
  fVar116 = fVar116 * 1.0000004;
  fVar121 = fVar121 * 1.0000004;
  fVar126 = fVar126 * 1.0000004;
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1378 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = local_1378 ^ 0x10;
  local_12c0 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar130 = ZEXT1664(local_12c0);
  iVar32 = (tray->tfar).field_0.i[k];
  auVar95 = ZEXT1664(CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32))));
  local_12d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar105 = fVar103;
  fVar106 = fVar103;
  fVar107 = fVar103;
  fVar109 = fVar108;
  fVar110 = fVar108;
  fVar111 = fVar108;
  fVar113 = fVar112;
  fVar114 = fVar112;
  fVar115 = fVar112;
  fVar118 = fVar116;
  fVar119 = fVar116;
  fVar120 = fVar116;
  fVar123 = fVar121;
  fVar124 = fVar121;
  fVar125 = fVar121;
  fVar127 = fVar126;
  fVar128 = fVar126;
  fVar129 = fVar126;
  local_12b0 = fVar126;
  fStack_12ac = fVar126;
  fStack_12a8 = fVar126;
  fStack_12a4 = fVar126;
  local_12a0 = fVar121;
  fStack_129c = fVar121;
  fStack_1298 = fVar121;
  fStack_1294 = fVar121;
  local_1290 = fVar116;
  fStack_128c = fVar116;
  fStack_1288 = fVar116;
  fStack_1284 = fVar116;
  local_1280 = fVar112;
  fStack_127c = fVar112;
  fStack_1278 = fVar112;
  fStack_1274 = fVar112;
  local_1270 = fVar108;
  fStack_126c = fVar108;
  fStack_1268 = fVar108;
  fStack_1264 = fVar108;
  local_1260 = fVar103;
  fStack_125c = fVar103;
  fStack_1258 = fVar103;
  fStack_1254 = fVar103;
LAB_01cdafd7:
  do {
    do {
      if (local_1390 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar23 = local_1390 + -1;
      local_1390 = local_1390 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar23 + 8));
    uVar38 = *(size_t *)*local_1390;
    while ((uVar38 & 8) == 0) {
      uVar25 = uVar38 & 0xfffffffffffffff0;
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar43._4_4_ = uVar100;
      auVar43._0_4_ = uVar100;
      auVar43._8_4_ = uVar100;
      auVar43._12_4_ = uVar100;
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar34),auVar43,
                                *(undefined1 (*) [16])(uVar25 + 0x20 + uVar34));
      auVar40 = vsubps_avx512vl(auVar40,auVar131._0_16_);
      auVar41._0_4_ = fVar103 * auVar40._0_4_;
      auVar41._4_4_ = fVar105 * auVar40._4_4_;
      auVar41._8_4_ = fVar106 * auVar40._8_4_;
      auVar41._12_4_ = fVar107 * auVar40._12_4_;
      auVar41 = vmaxps_avx512vl(auVar130._0_16_,auVar41);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + local_1378),auVar43,
                                *(undefined1 (*) [16])(uVar25 + 0x20 + local_1378));
      auVar40 = vsubps_avx512vl(auVar40,auVar132._0_16_);
      auVar42._0_4_ = fVar108 * auVar40._0_4_;
      auVar42._4_4_ = fVar109 * auVar40._4_4_;
      auVar42._8_4_ = fVar110 * auVar40._8_4_;
      auVar42._12_4_ = fVar111 * auVar40._12_4_;
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar37),auVar43,
                                *(undefined1 (*) [16])(uVar25 + 0x20 + uVar37));
      auVar40 = vsubps_avx(auVar40,auVar102._0_16_);
      auVar59._0_4_ = fVar112 * auVar40._0_4_;
      auVar59._4_4_ = fVar113 * auVar40._4_4_;
      auVar59._8_4_ = fVar114 * auVar40._8_4_;
      auVar59._12_4_ = fVar115 * auVar40._12_4_;
      auVar40 = vmaxps_avx(auVar42,auVar59);
      auVar40 = vmaxps_avx(auVar41,auVar40);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + (uVar34 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar25 + 0x20 + (uVar34 ^ 0x10)));
      auVar41 = vsubps_avx512vl(auVar41,auVar131._0_16_);
      auVar56._0_4_ = fVar116 * auVar41._0_4_;
      auVar56._4_4_ = fVar118 * auVar41._4_4_;
      auVar56._8_4_ = fVar119 * auVar41._8_4_;
      auVar56._12_4_ = fVar120 * auVar41._12_4_;
      auVar41 = vminps_avx(auVar95._0_16_,auVar56);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar36),auVar43,
                                *(undefined1 (*) [16])(uVar25 + 0x20 + uVar36));
      auVar42 = vsubps_avx512vl(auVar42,auVar132._0_16_);
      auVar66._0_4_ = fVar121 * auVar42._0_4_;
      auVar66._4_4_ = fVar123 * auVar42._4_4_;
      auVar66._8_4_ = fVar124 * auVar42._8_4_;
      auVar66._12_4_ = fVar125 * auVar42._12_4_;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + (uVar37 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar25 + 0x20 + (uVar37 ^ 0x10)));
      auVar42 = vsubps_avx(auVar42,auVar102._0_16_);
      auVar62._0_4_ = fVar126 * auVar42._0_4_;
      auVar62._4_4_ = fVar127 * auVar42._4_4_;
      auVar62._8_4_ = fVar128 * auVar42._8_4_;
      auVar62._12_4_ = fVar129 * auVar42._12_4_;
      auVar42 = vminps_avx(auVar66,auVar62);
      auVar41 = vminps_avx(auVar41,auVar42);
      uVar15 = vcmpps_avx512vl(auVar40,auVar41,2);
      uVar28 = (uint)uVar15;
      if (((uint)uVar38 & 7) == 6) {
        uVar16 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
        uVar17 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
        uVar28 = (uint)(byte)((byte)uVar16 & (byte)uVar17 & (byte)uVar15);
      }
      local_1180._0_16_ = auVar40;
      if ((byte)uVar28 == 0) goto LAB_01cdafd7;
      lVar18 = 0;
      for (uVar38 = (ulong)(byte)uVar28; (uVar38 & 1) == 0;
          uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar38 = *(ulong *)(uVar25 + lVar18 * 8);
      uVar28 = (uVar28 & 0xff) - 1 & uVar28 & 0xff;
      uVar39 = (ulong)uVar28;
      if (uVar28 != 0) {
        uVar29 = *(uint *)(local_1180 + lVar18 * 4);
        lVar18 = 0;
        for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        uVar28 = uVar28 - 1 & uVar28;
        uVar31 = (ulong)uVar28;
        uVar39 = *(ulong *)(uVar25 + lVar18 * 8);
        uVar2 = *(uint *)(local_1180 + lVar18 * 4);
        if (uVar28 == 0) {
          if (uVar29 < uVar2) {
            *(ulong *)*local_1390 = uVar39;
            *(uint *)((long)*local_1390 + 8) = uVar2;
            local_1390 = local_1390 + 1;
          }
          else {
            *(ulong *)*local_1390 = uVar38;
            *(uint *)((long)*local_1390 + 8) = uVar29;
            local_1390 = local_1390 + 1;
            uVar38 = uVar39;
          }
        }
        else {
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar38;
          auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar29));
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar39;
          auVar41 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar2));
          lVar18 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar28 = uVar28 - 1 & uVar28;
          uVar38 = (ulong)uVar28;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)(uVar25 + lVar18 * 8);
          auVar59 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_1180 + lVar18 * 4)));
          auVar42 = vpshufd_avx(auVar40,0xaa);
          auVar43 = vpshufd_avx(auVar41,0xaa);
          auVar56 = vpshufd_avx(auVar59,0xaa);
          if (uVar28 == 0) {
            uVar38 = vpcmpgtd_avx512vl(auVar43,auVar42);
            uVar38 = uVar38 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar41,auVar40);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar57._0_4_ = (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar42._0_4_;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar42._4_4_;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar42._8_4_;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar57._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar42._12_4_;
            auVar41 = vmovdqa32_avx512vl(auVar41);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar61._0_4_ = (uint)bVar9 * auVar41._0_4_ | (uint)!bVar9 * auVar40._0_4_;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar9 * auVar41._4_4_ | (uint)!bVar9 * auVar40._4_4_;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar9 * auVar41._8_4_ | (uint)!bVar9 * auVar40._8_4_;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar61._12_4_ = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar40._12_4_;
            auVar40 = vpshufd_avx(auVar57,0xaa);
            uVar25 = vpcmpgtd_avx512vl(auVar56,auVar40);
            uVar25 = uVar25 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar59,auVar57);
            bVar9 = (bool)((byte)uVar25 & 1);
            bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
            uVar38 = CONCAT44((uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_,
                              (uint)bVar9 * auVar41._0_4_ | (uint)!bVar9 * auVar40._0_4_);
            auVar40 = vmovdqa32_avx512vl(auVar59);
            bVar9 = (bool)((byte)uVar25 & 1);
            auVar49._0_4_ = (uint)bVar9 * auVar40._0_4_ | !bVar9 * auVar57._0_4_;
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar9 * auVar40._4_4_ | !bVar9 * auVar57._4_4_;
            bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar9 * auVar40._8_4_ | !bVar9 * auVar57._8_4_;
            bVar9 = SUB81(uVar25 >> 3,0);
            auVar49._12_4_ = (uint)bVar9 * auVar40._12_4_ | !bVar9 * auVar57._12_4_;
            auVar40 = vpshufd_avx(auVar49,0xaa);
            auVar41 = vpshufd_avx(auVar61,0xaa);
            uVar25 = vpcmpgtd_avx512vl(auVar40,auVar41);
            uVar25 = uVar25 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar49,auVar61);
            bVar9 = (bool)((byte)uVar25 & 1);
            auVar44._0_4_ = (uint)bVar9 * auVar41._0_4_ | (uint)!bVar9 * auVar40._0_4_;
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar9 * auVar41._4_4_ | (uint)!bVar9 * auVar40._4_4_;
            bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar9 * auVar41._8_4_ | (uint)!bVar9 * auVar40._8_4_;
            bVar9 = SUB81(uVar25 >> 3,0);
            auVar44._12_4_ = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar40._12_4_;
            auVar40 = vmovdqa32_avx512vl(auVar49);
            bVar9 = (bool)((byte)uVar25 & 1);
            auVar51._0_4_ = (uint)bVar9 * auVar40._0_4_ | !bVar9 * auVar61._0_4_;
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar9 * auVar40._4_4_ | !bVar9 * auVar61._4_4_;
            bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar9 * auVar40._8_4_ | !bVar9 * auVar61._8_4_;
            bVar9 = SUB81(uVar25 >> 3,0);
            auVar51._12_4_ = (uint)bVar9 * auVar40._12_4_ | !bVar9 * auVar61._12_4_;
            *local_1390 = auVar51;
            local_1390[1] = auVar44;
            local_1390 = local_1390 + 2;
          }
          else {
            lVar18 = 0;
            for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            uVar28 = *(uint *)(local_1180 + lVar18 * 4);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar25 + lVar18 * 8);
            auVar66 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar28));
            uVar38 = vpcmpgtd_avx512vl(auVar43,auVar42);
            uVar38 = uVar38 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar41,auVar40);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar53._0_4_ = (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar42._0_4_;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar42._4_4_;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar42._8_4_;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar53._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar42._12_4_;
            auVar41 = vmovdqa32_avx512vl(auVar41);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar55._0_4_ = (uint)bVar9 * auVar41._0_4_ | (uint)!bVar9 * auVar40._0_4_;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar9 * auVar41._4_4_ | (uint)!bVar9 * auVar40._4_4_;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar9 * auVar41._8_4_ | (uint)!bVar9 * auVar40._8_4_;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar55._12_4_ = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar40._12_4_;
            auVar52._4_4_ = uVar28;
            auVar52._0_4_ = uVar28;
            auVar52._8_4_ = uVar28;
            auVar52._12_4_ = uVar28;
            uVar38 = vpcmpgtd_avx512vl(auVar52,auVar56);
            uVar38 = uVar38 & 0xf;
            auVar40 = vpblendmd_avx512vl(auVar66,auVar59);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar58._0_4_ = (uint)bVar9 * auVar40._0_4_ | !bVar9 * uVar28;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar9 * auVar40._4_4_ | !bVar9 * uVar28;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar9 * auVar40._8_4_ | !bVar9 * uVar28;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar58._12_4_ = (uint)bVar9 * auVar40._12_4_ | !bVar9 * uVar28;
            auVar40 = vmovdqa32_avx512vl(auVar66);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar60._0_4_ = (uint)bVar9 * auVar40._0_4_ | (uint)!bVar9 * auVar59._0_4_;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar59._4_4_;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar59._8_4_;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar60._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * auVar59._12_4_;
            auVar40 = vpshufd_avx(auVar60,0xaa);
            auVar41 = vpshufd_avx(auVar55,0xaa);
            uVar38 = vpcmpgtd_avx512vl(auVar40,auVar41);
            uVar38 = uVar38 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar60,auVar55);
            bVar9 = (bool)((byte)uVar38 & 1);
            auVar45._0_4_ = (uint)bVar9 * auVar41._0_4_ | (uint)!bVar9 * auVar40._0_4_;
            bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar9 * auVar41._4_4_ | (uint)!bVar9 * auVar40._4_4_;
            bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar9 * auVar41._8_4_ | (uint)!bVar9 * auVar40._8_4_;
            bVar9 = SUB81(uVar38 >> 3,0);
            auVar45._12_4_ = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar40._12_4_;
            auVar42 = vmovdqa32_avx512vl(auVar60);
            bVar9 = (bool)((byte)uVar38 & 1);
            bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar38 >> 2) & 1);
            bVar14 = SUB81(uVar38 >> 3,0);
            auVar40 = vpshufd_avx(auVar58,0xaa);
            auVar41 = vpshufd_avx(auVar53,0xaa);
            uVar25 = vpcmpgtd_avx512vl(auVar40,auVar41);
            uVar25 = uVar25 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar58,auVar53);
            bVar10 = (bool)((byte)uVar25 & 1);
            bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
            uVar38 = CONCAT44((uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar40._4_4_,
                              (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar40._0_4_);
            auVar40 = vmovdqa32_avx512vl(auVar58);
            bVar10 = (bool)((byte)uVar25 & 1);
            auVar63._0_4_ = (uint)bVar10 * auVar40._0_4_ | !bVar10 * auVar53._0_4_;
            bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar10 * auVar40._4_4_ | !bVar10 * auVar53._4_4_;
            bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar10 * auVar40._8_4_ | !bVar10 * auVar53._8_4_;
            bVar10 = SUB81(uVar25 >> 3,0);
            auVar63._12_4_ = (uint)bVar10 * auVar40._12_4_ | !bVar10 * auVar53._12_4_;
            auVar40 = vpshufd_avx(auVar63,0xaa);
            auVar41 = vpshufd_avx(auVar45,0xaa);
            uVar25 = vpcmpgtd_avx512vl(auVar41,auVar40);
            uVar25 = uVar25 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar45,auVar63);
            bVar10 = (bool)((byte)uVar25 & 1);
            auVar46._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar40._0_4_;
            bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_;
            bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar40._8_4_;
            bVar10 = SUB81(uVar25 >> 3,0);
            auVar46._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar40._12_4_;
            auVar40 = vmovdqa32_avx512vl(auVar45);
            bVar10 = (bool)((byte)uVar25 & 1);
            auVar65._0_4_ = (uint)bVar10 * auVar40._0_4_ | !bVar10 * auVar63._0_4_;
            bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar10 * auVar40._4_4_ | !bVar10 * auVar63._4_4_;
            bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar10 * auVar40._8_4_ | !bVar10 * auVar63._8_4_;
            bVar10 = SUB81(uVar25 >> 3,0);
            auVar65._12_4_ = (uint)bVar10 * auVar40._12_4_ | !bVar10 * auVar63._12_4_;
            *(uint *)*local_1390 = (uint)bVar9 * auVar42._0_4_ | !bVar9 * auVar55._0_4_;
            *(uint *)((long)*local_1390 + 4) =
                 (uint)bVar11 * auVar42._4_4_ | !bVar11 * auVar55._4_4_;
            *(uint *)((long)*local_1390 + 8) =
                 (uint)bVar13 * auVar42._8_4_ | !bVar13 * auVar55._8_4_;
            *(uint *)((long)*local_1390 + 0xc) =
                 (uint)bVar14 * auVar42._12_4_ | !bVar14 * auVar55._12_4_;
            local_1390[1] = auVar65;
            local_1390[2] = auVar46;
            local_1390 = local_1390 + 3;
          }
        }
      }
    }
    local_1388 = (ulong)((uint)uVar38 & 0xf) - 8;
    uVar38 = uVar38 & 0xfffffffffffffff0;
    for (local_1380 = 0; local_1380 != local_1388; local_1380 = local_1380 + 1) {
      lVar35 = local_1380 * 0x60;
      pSVar3 = context->scene;
      pRVar4 = (pSVar3->geometries).items;
      pGVar5 = pRVar4[*(uint *)(uVar38 + 0x40 + lVar35)].ptr;
      fVar116 = (pGVar5->time_range).lower;
      fVar116 = pGVar5->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar116) / ((pGVar5->time_range).upper - fVar116)
                );
      auVar40 = vroundss_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),9);
      auVar40 = vminss_avx(auVar40,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
      auVar117 = vmaxss_avx(ZEXT816(0),auVar40);
      iVar32 = (int)auVar117._0_4_;
      lVar30 = (long)iVar32 * 0x38;
      lVar18 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar30);
      auVar40 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar38 + lVar35) * 4);
      uVar39 = (ulong)*(uint *)(uVar38 + 0x10 + lVar35);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar39 * 4);
      uVar31 = (ulong)*(uint *)(uVar38 + 0x20 + lVar35);
      auVar42 = *(undefined1 (*) [16])(lVar18 + uVar31 * 4);
      uVar33 = (ulong)*(uint *)(uVar38 + 0x30 + lVar35);
      auVar43 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
      uVar25 = (ulong)*(uint *)(uVar38 + 4 + lVar35);
      lVar26 = (long)(iVar32 + 1) * 0x38;
      lVar18 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar26);
      auVar56 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar38 + lVar35) * 4);
      auVar59 = *(undefined1 (*) [16])(lVar18 + uVar39 * 4);
      lVar6 = *(long *)&pRVar4[*(uint *)(uVar38 + 0x44 + lVar35)].ptr[2].numPrimitives;
      lVar7 = *(long *)(lVar6 + lVar30);
      auVar66 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
      auVar62 = *(undefined1 (*) [16])(lVar18 + uVar31 * 4);
      uVar31 = (ulong)*(uint *)(uVar38 + 0x14 + lVar35);
      auVar67 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
      auVar64 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
      uVar39 = (ulong)*(uint *)(uVar38 + 0x24 + lVar35);
      auVar53 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
      uVar33 = (ulong)*(uint *)(uVar38 + 0x34 + lVar35);
      auVar55 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
      lVar18 = *(long *)&pRVar4[*(uint *)(uVar38 + 0x48 + lVar35)].ptr[2].numPrimitives;
      lVar6 = *(long *)(lVar6 + lVar26);
      auVar58 = *(undefined1 (*) [16])(lVar6 + uVar25 * 4);
      lVar7 = *(long *)(lVar18 + lVar30);
      auVar60 = *(undefined1 (*) [16])(lVar6 + uVar31 * 4);
      uVar31 = (ulong)*(uint *)(uVar38 + 8 + lVar35);
      auVar45 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar6 + uVar39 * 4);
      uVar39 = (ulong)*(uint *)(uVar38 + 0x18 + lVar35);
      auVar46 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
      auVar65 = *(undefined1 (*) [16])(lVar6 + uVar33 * 4);
      uVar25 = (ulong)*(uint *)(uVar38 + 0x28 + lVar35);
      auVar52 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
      uVar33 = (ulong)*(uint *)(uVar38 + 0x38 + lVar35);
      auVar54 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
      lVar18 = *(long *)(lVar18 + lVar26);
      auVar57 = *(undefined1 (*) [16])(lVar18 + uVar31 * 4);
      lVar6 = *(long *)&pRVar4[*(uint *)(uVar38 + 0x4c + lVar35)].ptr[2].numPrimitives;
      lVar7 = *(long *)(lVar6 + lVar30);
      auVar61 = *(undefined1 (*) [16])(lVar18 + uVar39 * 4);
      uVar39 = (ulong)*(uint *)(uVar38 + 0xc + lVar35);
      auVar49 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
      auVar44 = *(undefined1 (*) [16])(lVar18 + uVar25 * 4);
      uVar31 = (ulong)*(uint *)(uVar38 + 0x1c + lVar35);
      auVar51 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
      auVar47 = vunpcklps_avx512vl(auVar40,auVar45);
      auVar45 = vunpckhps_avx(auVar40,auVar45);
      auVar48 = vunpcklps_avx512vl(auVar66,auVar49);
      auVar66 = vunpckhps_avx(auVar66,auVar49);
      auVar40 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
      uVar25 = (ulong)*(uint *)(uVar38 + 0x2c + lVar35);
      auVar45 = vunpcklps_avx(auVar45,auVar66);
      auVar49 = vunpcklps_avx512vl(auVar47,auVar48);
      auVar47 = vunpckhps_avx512vl(auVar47,auVar48);
      auVar48 = vunpcklps_avx512vl(auVar41,auVar46);
      auVar50 = vunpckhps_avx512vl(auVar41,auVar46);
      auVar46 = vunpcklps_avx(auVar67,auVar51);
      auVar66 = vunpckhps_avx(auVar67,auVar51);
      auVar41 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
      uVar33 = (ulong)*(uint *)(uVar38 + 0x3c + lVar35);
      auVar67 = vunpcklps_avx(auVar50,auVar66);
      auVar51 = vunpcklps_avx512vl(auVar48,auVar46);
      auVar66 = vunpckhps_avx(auVar48,auVar46);
      auVar48 = vunpcklps_avx512vl(auVar42,auVar52);
      auVar42 = vunpckhps_avx512vl(auVar42,auVar52);
      auVar52 = vunpcklps_avx512vl(auVar53,auVar41);
      auVar53 = vunpckhps_avx512vl(auVar53,auVar41);
      auVar41 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
      lVar18 = *(long *)(lVar6 + lVar26);
      auVar53 = vunpcklps_avx(auVar42,auVar53);
      auVar46 = vunpcklps_avx(auVar48,auVar52);
      auVar42 = vunpckhps_avx(auVar48,auVar52);
      auVar52 = vunpcklps_avx512vl(auVar43,auVar54);
      auVar43 = vunpckhps_avx512vl(auVar43,auVar54);
      auVar54 = vunpcklps_avx512vl(auVar55,auVar41);
      auVar55 = vunpckhps_avx512vl(auVar55,auVar41);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar39 * 4);
      auVar43 = vunpcklps_avx(auVar43,auVar55);
      auVar55 = vunpcklps_avx512vl(auVar52,auVar54);
      auVar52 = vunpckhps_avx512vl(auVar52,auVar54);
      auVar54 = vunpcklps_avx512vl(auVar56,auVar57);
      auVar56 = vunpckhps_avx512vl(auVar56,auVar57);
      auVar57 = vunpcklps_avx512vl(auVar58,auVar41);
      auVar58 = vunpckhps_avx512vl(auVar58,auVar41);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar31 * 4);
      auVar58 = vunpcklps_avx512vl(auVar56,auVar58);
      auVar48 = vunpcklps_avx512vl(auVar54,auVar57);
      auVar54 = vunpckhps_avx512vl(auVar54,auVar57);
      auVar56 = vunpcklps_avx512vl(auVar59,auVar61);
      auVar59 = vunpckhps_avx512vl(auVar59,auVar61);
      auVar57 = vunpcklps_avx512vl(auVar60,auVar41);
      auVar60 = vunpckhps_avx512vl(auVar60,auVar41);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar25 * 4);
      auVar59 = vunpcklps_avx512vl(auVar59,auVar60);
      auVar60 = vunpcklps_avx512vl(auVar56,auVar57);
      auVar57 = vunpckhps_avx512vl(auVar56,auVar57);
      auVar61 = vunpcklps_avx512vl(auVar62,auVar44);
      auVar56 = vunpckhps_avx512vl(auVar62,auVar44);
      auVar62 = vunpcklps_avx512vl(auVar63,auVar41);
      auVar63 = vunpckhps_avx512vl(auVar63,auVar41);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
      auVar56 = vunpcklps_avx(auVar56,auVar63);
      auVar63 = vunpcklps_avx512vl(auVar61,auVar62);
      auVar62 = vunpckhps_avx512vl(auVar61,auVar62);
      auVar61 = vunpcklps_avx512vl(auVar64,auVar40);
      auVar40 = vunpckhps_avx512vl(auVar64,auVar40);
      auVar64 = vunpcklps_avx512vl(auVar65,auVar41);
      auVar41 = vunpckhps_avx512vl(auVar65,auVar41);
      auVar40 = vunpcklps_avx(auVar40,auVar41);
      auVar65 = vunpcklps_avx512vl(auVar61,auVar64);
      auVar64 = vunpckhps_avx512vl(auVar61,auVar64);
      auVar41 = ZEXT416((uint)(fVar116 - auVar117._0_4_));
      auVar61 = vbroadcastss_avx512vl(auVar41);
      auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar41);
      auVar117._0_4_ = auVar41._0_4_;
      auVar117._4_4_ = auVar117._0_4_;
      auVar117._8_4_ = auVar117._0_4_;
      auVar117._12_4_ = auVar117._0_4_;
      auVar41 = vmulps_avx512vl(auVar61,auVar48);
      auVar49 = vfmadd231ps_avx512vl(auVar41,auVar117,auVar49);
      auVar41 = vmulps_avx512vl(auVar61,auVar54);
      auVar54 = vfmadd231ps_avx512vl(auVar41,auVar117,auVar47);
      auVar41 = vmulps_avx512vl(auVar61,auVar58);
      auVar41 = vfmadd231ps_fma(auVar41,auVar117,auVar45);
      auVar58 = vmulps_avx512vl(auVar61,auVar60);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar117,auVar51);
      auVar68 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x10 + lVar35));
      local_fc0 = vmovdqa64_avx512vl(auVar68);
      auVar68 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x14 + lVar35));
      auVar60 = vmulps_avx512vl(auVar61,auVar57);
      auVar59 = vmulps_avx512vl(auVar61,auVar59);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar117,auVar66);
      auVar59 = vfmadd231ps_fma(auVar59,auVar117,auVar67);
      auVar66 = vmulps_avx512vl(auVar61,auVar63);
      auVar62 = vmulps_avx512vl(auVar61,auVar62);
      auVar67 = vmulps_avx512vl(auVar61,auVar56);
      auVar56 = vfmadd231ps_fma(auVar66,auVar117,auVar46);
      auVar42 = vfmadd231ps_fma(auVar62,auVar117,auVar42);
      auVar66 = vfmadd231ps_fma(auVar67,auVar117,auVar53);
      auVar62 = vmulps_avx512vl(auVar61,auVar65);
      auVar67 = vmulps_avx512vl(auVar61,auVar64);
      auVar64 = vmulps_avx512vl(auVar61,auVar40);
      auVar40 = vfmadd231ps_fma(auVar62,auVar117,auVar55);
      auVar62 = vfmadd231ps_fma(auVar67,auVar117,auVar52);
      auVar43 = vfmadd231ps_fma(auVar64,auVar117,auVar43);
      local_1240 = vmovdqa64_avx512vl(auVar68);
      auVar68 = vinsertf32x4_avx512vl(ZEXT1632(auVar49),auVar56,1);
      auVar69 = vinsertf32x4_avx512vl(ZEXT1632(auVar54),auVar42,1);
      auVar73._16_16_ = auVar66;
      auVar73._0_16_ = auVar41;
      auVar76._16_16_ = auVar58;
      auVar76._0_16_ = auVar58;
      auVar70 = vinsertf32x4_avx512vl(ZEXT1632(auVar60),auVar60,1);
      auVar78._16_16_ = auVar59;
      auVar78._0_16_ = auVar59;
      auVar77._16_16_ = auVar40;
      auVar77._0_16_ = auVar40;
      auVar79._16_16_ = auVar62;
      auVar79._0_16_ = auVar62;
      uVar100 = *(undefined4 *)(ray + k * 4);
      auVar80._4_4_ = uVar100;
      auVar80._0_4_ = uVar100;
      auVar80._8_4_ = uVar100;
      auVar80._12_4_ = uVar100;
      auVar80._16_4_ = uVar100;
      auVar80._20_4_ = uVar100;
      auVar80._24_4_ = uVar100;
      auVar80._28_4_ = uVar100;
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar81._4_4_ = uVar100;
      auVar81._0_4_ = uVar100;
      auVar81._8_4_ = uVar100;
      auVar81._12_4_ = uVar100;
      auVar81._16_4_ = uVar100;
      auVar81._20_4_ = uVar100;
      auVar81._24_4_ = uVar100;
      auVar81._28_4_ = uVar100;
      auVar71 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar96._4_4_ = uVar100;
      auVar96._0_4_ = uVar100;
      auVar96._8_4_ = uVar100;
      auVar96._12_4_ = uVar100;
      auVar96._16_4_ = uVar100;
      auVar96._20_4_ = uVar100;
      auVar96._24_4_ = uVar100;
      auVar96._28_4_ = uVar100;
      auVar72 = vinsertf32x4_avx512vl(ZEXT1632(auVar43),auVar43,1);
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar99._4_4_ = uVar100;
      auVar99._0_4_ = uVar100;
      auVar99._8_4_ = uVar100;
      auVar99._12_4_ = uVar100;
      auVar99._16_4_ = uVar100;
      auVar99._20_4_ = uVar100;
      auVar99._24_4_ = uVar100;
      auVar99._28_4_ = uVar100;
      fVar116 = *(float *)(ray + k * 4 + 0x60);
      auVar104._4_4_ = fVar116;
      auVar104._0_4_ = fVar116;
      auVar104._8_4_ = fVar116;
      auVar104._12_4_ = fVar116;
      auVar104._16_4_ = fVar116;
      auVar104._20_4_ = fVar116;
      auVar104._24_4_ = fVar116;
      auVar104._28_4_ = fVar116;
      auVar68 = vsubps_avx(auVar68,auVar80);
      auVar69 = vsubps_avx(auVar69,auVar81);
      auVar73 = vsubps_avx512vl(auVar73,auVar71);
      auVar74 = vsubps_avx512vl(auVar76,auVar80);
      auVar75 = vsubps_avx512vl(auVar70,auVar81);
      auVar76 = vsubps_avx512vl(auVar78,auVar71);
      auVar70 = vsubps_avx(auVar77,auVar80);
      auVar77 = vsubps_avx512vl(auVar79,auVar81);
      auVar72 = vsubps_avx512vl(auVar72,auVar71);
      auVar71 = vsubps_avx(auVar70,auVar68);
      auVar78 = vsubps_avx512vl(auVar77,auVar69);
      auVar79 = vsubps_avx512vl(auVar72,auVar73);
      auVar80 = vsubps_avx512vl(auVar68,auVar74);
      auVar81 = vsubps_avx512vl(auVar69,auVar75);
      auVar82 = vsubps_avx512vl(auVar73,auVar76);
      auVar87._0_4_ = auVar70._0_4_ + auVar68._0_4_;
      auVar87._4_4_ = auVar70._4_4_ + auVar68._4_4_;
      auVar87._8_4_ = auVar70._8_4_ + auVar68._8_4_;
      auVar87._12_4_ = auVar70._12_4_ + auVar68._12_4_;
      auVar87._16_4_ = auVar70._16_4_ + auVar68._16_4_;
      auVar87._20_4_ = auVar70._20_4_ + auVar68._20_4_;
      auVar87._24_4_ = auVar70._24_4_ + auVar68._24_4_;
      auVar87._28_4_ = auVar70._28_4_ + auVar68._28_4_;
      auVar83 = vaddps_avx512vl(auVar77,auVar69);
      auVar84 = vaddps_avx512vl(auVar72,auVar73);
      auVar85._4_4_ = auVar79._4_4_ * auVar83._4_4_;
      auVar85._0_4_ = auVar79._0_4_ * auVar83._0_4_;
      auVar85._8_4_ = auVar79._8_4_ * auVar83._8_4_;
      auVar85._12_4_ = auVar79._12_4_ * auVar83._12_4_;
      auVar85._16_4_ = auVar79._16_4_ * auVar83._16_4_;
      auVar85._20_4_ = auVar79._20_4_ * auVar83._20_4_;
      auVar85._24_4_ = auVar79._24_4_ * auVar83._24_4_;
      auVar85._28_4_ = auVar66._12_4_;
      auVar41 = vfmsub231ps_fma(auVar85,auVar78,auVar84);
      auVar86._4_4_ = auVar71._4_4_ * auVar84._4_4_;
      auVar86._0_4_ = auVar71._0_4_ * auVar84._0_4_;
      auVar86._8_4_ = auVar71._8_4_ * auVar84._8_4_;
      auVar86._12_4_ = auVar71._12_4_ * auVar84._12_4_;
      auVar86._16_4_ = auVar71._16_4_ * auVar84._16_4_;
      auVar86._20_4_ = auVar71._20_4_ * auVar84._20_4_;
      auVar86._24_4_ = auVar71._24_4_ * auVar84._24_4_;
      auVar86._28_4_ = auVar84._28_4_;
      auVar40 = vfmsub231ps_fma(auVar86,auVar79,auVar87);
      auVar84._4_4_ = auVar78._4_4_ * auVar87._4_4_;
      auVar84._0_4_ = auVar78._0_4_ * auVar87._0_4_;
      auVar84._8_4_ = auVar78._8_4_ * auVar87._8_4_;
      auVar84._12_4_ = auVar78._12_4_ * auVar87._12_4_;
      auVar84._16_4_ = auVar78._16_4_ * auVar87._16_4_;
      auVar84._20_4_ = auVar78._20_4_ * auVar87._20_4_;
      auVar84._24_4_ = auVar78._24_4_ * auVar87._24_4_;
      auVar84._28_4_ = auVar87._28_4_;
      auVar42 = vfmsub231ps_fma(auVar84,auVar71,auVar83);
      auVar90._0_4_ = fVar116 * auVar42._0_4_;
      auVar90._4_4_ = fVar116 * auVar42._4_4_;
      auVar90._8_4_ = fVar116 * auVar42._8_4_;
      auVar90._12_4_ = fVar116 * auVar42._12_4_;
      auVar90._16_4_ = fVar116 * 0.0;
      auVar90._20_4_ = fVar116 * 0.0;
      auVar90._24_4_ = fVar116 * 0.0;
      auVar90._28_4_ = 0;
      auVar40 = vfmadd231ps_fma(auVar90,auVar99,ZEXT1632(auVar40));
      auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar96,ZEXT1632(auVar41));
      auVar85 = vaddps_avx512vl(auVar68,auVar74);
      auVar86 = vaddps_avx512vl(auVar69,auVar75);
      auVar84 = vaddps_avx512vl(auVar73,auVar76);
      auVar83 = vmulps_avx512vl(auVar86,auVar82);
      auVar87 = vfmsub231ps_avx512vl(auVar83,auVar81,auVar84);
      auVar83._4_4_ = auVar80._4_4_ * auVar84._4_4_;
      auVar83._0_4_ = auVar80._0_4_ * auVar84._0_4_;
      auVar83._8_4_ = auVar80._8_4_ * auVar84._8_4_;
      auVar83._12_4_ = auVar80._12_4_ * auVar84._12_4_;
      auVar83._16_4_ = auVar80._16_4_ * auVar84._16_4_;
      auVar83._20_4_ = auVar80._20_4_ * auVar84._20_4_;
      auVar83._24_4_ = auVar80._24_4_ * auVar84._24_4_;
      auVar83._28_4_ = auVar84._28_4_;
      auVar84 = vfmsub231ps_avx512vl(auVar83,auVar82,auVar85);
      auVar85 = vmulps_avx512vl(auVar85,auVar81);
      auVar41 = vfmsub231ps_fma(auVar85,auVar80,auVar86);
      auVar85 = vsubps_avx512vl(auVar74,auVar70);
      auVar98._0_4_ = fVar116 * auVar41._0_4_;
      auVar98._4_4_ = fVar116 * auVar41._4_4_;
      auVar98._8_4_ = fVar116 * auVar41._8_4_;
      auVar98._12_4_ = fVar116 * auVar41._12_4_;
      auVar98._16_4_ = fVar116 * 0.0;
      auVar98._20_4_ = fVar116 * 0.0;
      auVar98._24_4_ = fVar116 * 0.0;
      auVar98._28_4_ = 0;
      auVar41 = vfmadd231ps_fma(auVar98,auVar99,auVar84);
      auVar86 = vsubps_avx512vl(auVar75,auVar77);
      local_1160 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar96,auVar87);
      auVar84 = vsubps_avx512vl(auVar76,auVar72);
      auVar70 = vaddps_avx512vl(auVar74,auVar70);
      auVar74 = vaddps_avx512vl(auVar75,auVar77);
      auVar72 = vaddps_avx512vl(auVar76,auVar72);
      auVar83 = vmulps_avx512vl(auVar74,auVar84);
      auVar83 = vfmsub231ps_avx512vl(auVar83,auVar86,auVar72);
      auVar72 = vmulps_avx512vl(auVar72,auVar85);
      auVar72 = vfmsub231ps_avx512vl(auVar72,auVar84,auVar70);
      auVar75._4_4_ = auVar70._4_4_ * auVar86._4_4_;
      auVar75._0_4_ = auVar70._0_4_ * auVar86._0_4_;
      auVar75._8_4_ = auVar70._8_4_ * auVar86._8_4_;
      auVar75._12_4_ = auVar70._12_4_ * auVar86._12_4_;
      auVar75._16_4_ = auVar70._16_4_ * auVar86._16_4_;
      auVar75._20_4_ = auVar70._20_4_ * auVar86._20_4_;
      auVar75._24_4_ = auVar70._24_4_ * auVar86._24_4_;
      auVar75._28_4_ = auVar70._28_4_;
      auVar70 = vfmsub231ps_avx512vl(auVar75,auVar85,auVar74);
      auVar70 = vmulps_avx512vl(auVar70,auVar104);
      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar99,auVar72);
      auVar83 = vfmadd231ps_avx512vl(auVar70,auVar96,auVar83);
      auVar122._0_4_ = auVar40._0_4_ + local_1160._0_4_;
      auVar122._4_4_ = auVar40._4_4_ + local_1160._4_4_;
      auVar122._8_4_ = auVar40._8_4_ + local_1160._8_4_;
      auVar122._12_4_ = auVar40._12_4_ + local_1160._12_4_;
      auVar122._16_4_ = local_1160._16_4_ + 0.0;
      auVar122._20_4_ = local_1160._20_4_ + 0.0;
      auVar122._24_4_ = local_1160._24_4_ + 0.0;
      auVar122._28_4_ = local_1160._28_4_ + 0.0;
      local_1140 = vaddps_avx512vl(auVar83,auVar122);
      auVar70._8_4_ = 0x7fffffff;
      auVar70._0_8_ = 0x7fffffff7fffffff;
      auVar70._12_4_ = 0x7fffffff;
      auVar70._16_4_ = 0x7fffffff;
      auVar70._20_4_ = 0x7fffffff;
      auVar70._24_4_ = 0x7fffffff;
      auVar70._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_1140,auVar70);
      auVar72._8_4_ = 0x34000000;
      auVar72._0_8_ = 0x3400000034000000;
      auVar72._12_4_ = 0x34000000;
      auVar72._16_4_ = 0x34000000;
      auVar72._20_4_ = 0x34000000;
      auVar72._24_4_ = 0x34000000;
      auVar72._28_4_ = 0x34000000;
      auVar70 = vmulps_avx512vl(local_1140,auVar72);
      auVar75 = ZEXT1632(auVar40);
      auVar72 = vminps_avx512vl(auVar75,local_1160);
      auVar72 = vminps_avx512vl(auVar72,auVar83);
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar74._16_4_ = 0x80000000;
      auVar74._20_4_ = 0x80000000;
      auVar74._24_4_ = 0x80000000;
      auVar74._28_4_ = 0x80000000;
      auVar74 = vxorps_avx512vl(auVar70,auVar74);
      uVar15 = vcmpps_avx512vl(auVar72,auVar74,5);
      auVar72 = vmaxps_avx512vl(auVar75,local_1160);
      auVar72 = vmaxps_avx512vl(auVar72,auVar83);
      uVar16 = vcmpps_avx512vl(auVar72,auVar70,2);
      bVar24 = (byte)uVar15 | (byte)uVar16;
      if (bVar24 != 0) {
        auVar70 = vmulps_avx512vl(auVar81,auVar79);
        auVar72 = vmulps_avx512vl(auVar71,auVar82);
        auVar74 = vmulps_avx512vl(auVar80,auVar78);
        auVar83 = vmulps_avx512vl(auVar86,auVar82);
        auVar76 = vmulps_avx512vl(auVar80,auVar84);
        auVar77 = vmulps_avx512vl(auVar85,auVar81);
        auVar78 = vfmsub213ps_avx512vl(auVar78,auVar82,auVar70);
        auVar79 = vfmsub213ps_avx512vl(auVar79,auVar80,auVar72);
        auVar71 = vfmsub213ps_avx512vl(auVar71,auVar81,auVar74);
        auVar84 = vfmsub213ps_avx512vl(auVar84,auVar81,auVar83);
        auVar85 = vfmsub213ps_avx512vl(auVar85,auVar82,auVar76);
        auVar86 = vfmsub213ps_avx512vl(auVar86,auVar80,auVar77);
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar70,auVar80);
        vandps_avx512vl(auVar83,auVar80);
        uVar25 = vcmpps_avx512vl(auVar80,auVar80,1);
        vandps_avx512vl(auVar72,auVar80);
        vandps_avx512vl(auVar76,auVar80);
        uVar39 = vcmpps_avx512vl(auVar80,auVar80,1);
        vandps_avx512vl(auVar74,auVar80);
        vandps_avx512vl(auVar77,auVar80);
        uVar31 = vcmpps_avx512vl(auVar80,auVar80,1);
        bVar9 = (bool)((byte)uVar25 & 1);
        local_1120._0_4_ = (float)((uint)bVar9 * auVar78._0_4_ | (uint)!bVar9 * auVar84._0_4_);
        bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
        local_1120._4_4_ = (float)((uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar84._4_4_);
        bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
        local_1120._8_4_ = (float)((uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar84._8_4_);
        bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
        local_1120._12_4_ = (float)((uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar84._12_4_);
        bVar9 = (bool)((byte)(uVar25 >> 4) & 1);
        local_1120._16_4_ = (float)((uint)bVar9 * auVar78._16_4_ | (uint)!bVar9 * auVar84._16_4_);
        bVar9 = (bool)((byte)(uVar25 >> 5) & 1);
        local_1120._20_4_ = (float)((uint)bVar9 * auVar78._20_4_ | (uint)!bVar9 * auVar84._20_4_);
        bVar9 = (bool)((byte)(uVar25 >> 6) & 1);
        local_1120._24_4_ = (float)((uint)bVar9 * auVar78._24_4_ | (uint)!bVar9 * auVar84._24_4_);
        bVar9 = SUB81(uVar25 >> 7,0);
        local_1120._28_4_ = (uint)bVar9 * auVar78._28_4_ | (uint)!bVar9 * auVar84._28_4_;
        bVar9 = (bool)((byte)uVar39 & 1);
        local_1100._0_4_ = (float)((uint)bVar9 * auVar79._0_4_ | (uint)!bVar9 * auVar85._0_4_);
        bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
        local_1100._4_4_ = (float)((uint)bVar9 * auVar79._4_4_ | (uint)!bVar9 * auVar85._4_4_);
        bVar9 = (bool)((byte)(uVar39 >> 2) & 1);
        local_1100._8_4_ = (float)((uint)bVar9 * auVar79._8_4_ | (uint)!bVar9 * auVar85._8_4_);
        bVar9 = (bool)((byte)(uVar39 >> 3) & 1);
        local_1100._12_4_ = (float)((uint)bVar9 * auVar79._12_4_ | (uint)!bVar9 * auVar85._12_4_);
        bVar9 = (bool)((byte)(uVar39 >> 4) & 1);
        local_1100._16_4_ = (float)((uint)bVar9 * auVar79._16_4_ | (uint)!bVar9 * auVar85._16_4_);
        bVar9 = (bool)((byte)(uVar39 >> 5) & 1);
        local_1100._20_4_ = (float)((uint)bVar9 * auVar79._20_4_ | (uint)!bVar9 * auVar85._20_4_);
        bVar9 = (bool)((byte)(uVar39 >> 6) & 1);
        local_1100._24_4_ = (float)((uint)bVar9 * auVar79._24_4_ | (uint)!bVar9 * auVar85._24_4_);
        bVar9 = SUB81(uVar39 >> 7,0);
        local_1100._28_4_ = (uint)bVar9 * auVar79._28_4_ | (uint)!bVar9 * auVar85._28_4_;
        bVar9 = (bool)((byte)uVar31 & 1);
        local_10e0._0_4_ = (float)((uint)bVar9 * auVar71._0_4_ | (uint)!bVar9 * auVar86._0_4_);
        bVar9 = (bool)((byte)(uVar31 >> 1) & 1);
        local_10e0._4_4_ = (float)((uint)bVar9 * auVar71._4_4_ | (uint)!bVar9 * auVar86._4_4_);
        bVar9 = (bool)((byte)(uVar31 >> 2) & 1);
        local_10e0._8_4_ = (float)((uint)bVar9 * auVar71._8_4_ | (uint)!bVar9 * auVar86._8_4_);
        bVar9 = (bool)((byte)(uVar31 >> 3) & 1);
        local_10e0._12_4_ = (float)((uint)bVar9 * auVar71._12_4_ | (uint)!bVar9 * auVar86._12_4_);
        bVar9 = (bool)((byte)(uVar31 >> 4) & 1);
        local_10e0._16_4_ = (float)((uint)bVar9 * auVar71._16_4_ | (uint)!bVar9 * auVar86._16_4_);
        bVar9 = (bool)((byte)(uVar31 >> 5) & 1);
        local_10e0._20_4_ = (float)((uint)bVar9 * auVar71._20_4_ | (uint)!bVar9 * auVar86._20_4_);
        bVar9 = (bool)((byte)(uVar31 >> 6) & 1);
        local_10e0._24_4_ = (float)((uint)bVar9 * auVar71._24_4_ | (uint)!bVar9 * auVar86._24_4_);
        bVar9 = SUB81(uVar31 >> 7,0);
        local_10e0._28_4_ = (uint)bVar9 * auVar71._28_4_ | (uint)!bVar9 * auVar86._28_4_;
        auVar71._4_4_ = fVar116 * local_10e0._4_4_;
        auVar71._0_4_ = fVar116 * local_10e0._0_4_;
        auVar71._8_4_ = fVar116 * local_10e0._8_4_;
        auVar71._12_4_ = fVar116 * local_10e0._12_4_;
        auVar71._16_4_ = fVar116 * local_10e0._16_4_;
        auVar71._20_4_ = fVar116 * local_10e0._20_4_;
        auVar71._24_4_ = fVar116 * local_10e0._24_4_;
        auVar71._28_4_ = fVar116;
        auVar41 = vfmadd213ps_fma(auVar99,local_1100,auVar71);
        auVar41 = vfmadd213ps_fma(auVar96,local_1120,ZEXT1632(auVar41));
        auVar70 = ZEXT1632(CONCAT412(auVar41._12_4_ + auVar41._12_4_,
                                     CONCAT48(auVar41._8_4_ + auVar41._8_4_,
                                              CONCAT44(auVar41._4_4_ + auVar41._4_4_,
                                                       auVar41._0_4_ + auVar41._0_4_))));
        auVar82._0_4_ = auVar73._0_4_ * local_10e0._0_4_;
        auVar82._4_4_ = auVar73._4_4_ * local_10e0._4_4_;
        auVar82._8_4_ = auVar73._8_4_ * local_10e0._8_4_;
        auVar82._12_4_ = auVar73._12_4_ * local_10e0._12_4_;
        auVar82._16_4_ = auVar73._16_4_ * local_10e0._16_4_;
        auVar82._20_4_ = auVar73._20_4_ * local_10e0._20_4_;
        auVar82._24_4_ = auVar73._24_4_ * local_10e0._24_4_;
        auVar82._28_4_ = 0;
        auVar41 = vfmadd213ps_fma(auVar69,local_1100,auVar82);
        auVar42 = vfmadd213ps_fma(auVar68,local_1120,ZEXT1632(auVar41));
        auVar69 = vrcp14ps_avx512vl(auVar70);
        auVar68._8_4_ = 0x3f800000;
        auVar68._0_8_ = 0x3f8000003f800000;
        auVar68._12_4_ = 0x3f800000;
        auVar68._16_4_ = 0x3f800000;
        auVar68._20_4_ = 0x3f800000;
        auVar68._24_4_ = 0x3f800000;
        auVar68._28_4_ = 0x3f800000;
        auVar68 = vfnmadd213ps_avx512vl(auVar69,auVar70,auVar68);
        auVar41 = vfmadd132ps_fma(auVar68,auVar69,auVar69);
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar101._4_4_ = uVar100;
        auVar101._0_4_ = uVar100;
        auVar101._8_4_ = uVar100;
        auVar101._12_4_ = uVar100;
        auVar101._16_4_ = uVar100;
        auVar101._20_4_ = uVar100;
        auVar101._24_4_ = uVar100;
        auVar101._28_4_ = uVar100;
        auVar102 = ZEXT3264(auVar101);
        local_1060 = ZEXT1632(CONCAT412(auVar41._12_4_ * (auVar42._12_4_ + auVar42._12_4_),
                                        CONCAT48(auVar41._8_4_ * (auVar42._8_4_ + auVar42._8_4_),
                                                 CONCAT44(auVar41._4_4_ *
                                                          (auVar42._4_4_ + auVar42._4_4_),
                                                          auVar41._0_4_ *
                                                          (auVar42._0_4_ + auVar42._0_4_)))));
        auVar95 = ZEXT3264(local_1060);
        uVar15 = vcmpps_avx512vl(local_1060,auVar101,2);
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar69._4_4_ = uVar100;
        auVar69._0_4_ = uVar100;
        auVar69._8_4_ = uVar100;
        auVar69._12_4_ = uVar100;
        auVar69._16_4_ = uVar100;
        auVar69._20_4_ = uVar100;
        auVar69._24_4_ = uVar100;
        auVar69._28_4_ = uVar100;
        uVar16 = vcmpps_avx512vl(local_1060,auVar69,0xd);
        bVar24 = (byte)uVar15 & (byte)uVar16 & bVar24;
        if (bVar24 != 0) {
          uVar25 = vcmpps_avx512vl(auVar70,_DAT_01f7b000,4);
          uVar25 = bVar24 & uVar25;
          local_10c0 = (byte)uVar25;
          if (local_10c0 != 0) {
            local_1180 = auVar75;
            local_fe0 = 0xf0;
            auVar19._8_4_ = 0x219392ef;
            auVar19._0_8_ = 0x219392ef219392ef;
            auVar19._12_4_ = 0x219392ef;
            auVar19._16_4_ = 0x219392ef;
            auVar19._20_4_ = 0x219392ef;
            auVar19._24_4_ = 0x219392ef;
            auVar19._28_4_ = 0x219392ef;
            uVar39 = vcmpps_avx512vl(local_1140,auVar19,5);
            auVar69 = vrcp14ps_avx512vl(local_1140);
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar97._16_4_ = 0x3f800000;
            auVar97._20_4_ = 0x3f800000;
            auVar97._24_4_ = 0x3f800000;
            auVar97._28_4_ = 0x3f800000;
            auVar41 = vfnmadd213ps_fma(local_1140,auVar69,auVar97);
            auVar68 = vfmadd132ps_avx512vl(ZEXT1632(auVar41),auVar69,auVar69);
            fVar121 = (float)((uint)((byte)uVar39 & 1) * auVar68._0_4_);
            fVar116 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar68._4_4_);
            fVar105 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar68._8_4_);
            fVar112 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar68._12_4_);
            fVar108 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar68._16_4_);
            fVar103 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar68._20_4_);
            fVar126 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar68._24_4_);
            auVar91._0_4_ = fVar121 * auVar40._0_4_;
            auVar91._4_4_ = fVar116 * auVar40._4_4_;
            auVar91._8_4_ = fVar105 * auVar40._8_4_;
            auVar91._12_4_ = fVar112 * auVar40._12_4_;
            auVar91._16_4_ = fVar108 * 0.0;
            auVar91._20_4_ = fVar103 * 0.0;
            auVar91._24_4_ = fVar126 * 0.0;
            auVar91._28_4_ = 0;
            auVar68 = vminps_avx(auVar91,auVar97);
            auVar20._4_4_ = fVar116 * local_1160._4_4_;
            auVar20._0_4_ = fVar121 * local_1160._0_4_;
            auVar20._8_4_ = fVar105 * local_1160._8_4_;
            auVar20._12_4_ = fVar112 * local_1160._12_4_;
            auVar20._16_4_ = fVar108 * local_1160._16_4_;
            auVar20._20_4_ = fVar103 * local_1160._20_4_;
            auVar20._24_4_ = fVar126 * local_1160._24_4_;
            auVar20._28_4_ = auVar69._28_4_;
            auVar69 = vminps_avx(auVar20,auVar97);
            auVar70 = vsubps_avx(auVar97,auVar68);
            auVar71 = vsubps_avx(auVar97,auVar69);
            local_1080 = vblendps_avx(auVar69,auVar70,0xf0);
            local_10a0 = vblendps_avx(auVar68,auVar71,0xf0);
            fVar116 = (float)DAT_01fbac00;
            fVar121 = DAT_01fbac00._4_4_;
            fVar126 = DAT_01fbac00._8_4_;
            fVar103 = DAT_01fbac00._12_4_;
            fVar108 = DAT_01fbac00._16_4_;
            fVar112 = DAT_01fbac00._20_4_;
            fVar105 = DAT_01fbac00._24_4_;
            local_1040[0] = local_1120._0_4_ * fVar116;
            local_1040[1] = local_1120._4_4_ * fVar121;
            local_1040[2] = local_1120._8_4_ * fVar126;
            local_1040[3] = local_1120._12_4_ * fVar103;
            fStack_1030 = local_1120._16_4_ * fVar108;
            fStack_102c = local_1120._20_4_ * fVar112;
            fStack_1028 = local_1120._24_4_ * fVar105;
            uStack_1024 = local_10a0._28_4_;
            local_1020[0] = local_1100._0_4_ * fVar116;
            local_1020[1] = local_1100._4_4_ * fVar121;
            local_1020[2] = local_1100._8_4_ * fVar126;
            local_1020[3] = local_1100._12_4_ * fVar103;
            fStack_1010 = local_1100._16_4_ * fVar108;
            fStack_100c = local_1100._20_4_ * fVar112;
            fStack_1008 = local_1100._24_4_ * fVar105;
            uStack_1004 = local_1100._28_4_;
            local_1000[0] = local_10e0._0_4_ * fVar116;
            local_1000[1] = local_10e0._4_4_ * fVar121;
            local_1000[2] = local_10e0._8_4_ * fVar126;
            local_1000[3] = local_10e0._12_4_ * fVar103;
            fStack_ff0 = local_10e0._16_4_ * fVar108;
            fStack_fec = local_10e0._20_4_ * fVar112;
            fStack_fe8 = local_10e0._24_4_ * fVar105;
            uStack_fe4 = local_10e0._28_4_;
            auVar92._8_4_ = 0x7f800000;
            auVar92._0_8_ = 0x7f8000007f800000;
            auVar92._12_4_ = 0x7f800000;
            auVar92._16_4_ = 0x7f800000;
            auVar92._20_4_ = 0x7f800000;
            auVar92._24_4_ = 0x7f800000;
            auVar92._28_4_ = 0x7f800000;
            auVar68 = vblendmps_avx512vl(auVar92,local_1060);
            auVar88._0_4_ =
                 (uint)(local_10c0 & 1) * auVar68._0_4_ | (uint)!(bool)(local_10c0 & 1) * 0x7f800000
            ;
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar88._4_4_ = (uint)bVar9 * auVar68._4_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar88._8_4_ = (uint)bVar9 * auVar68._8_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar88._12_4_ = (uint)bVar9 * auVar68._12_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar88._16_4_ = (uint)bVar9 * auVar68._16_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar88._20_4_ = (uint)bVar9 * auVar68._20_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar88._24_4_ = (uint)bVar9 * auVar68._24_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = SUB81(uVar25 >> 7,0);
            auVar88._28_4_ = (uint)bVar9 * auVar68._28_4_ | (uint)!bVar9 * 0x7f800000;
            auVar68 = vshufps_avx(auVar88,auVar88,0xb1);
            auVar68 = vminps_avx(auVar88,auVar68);
            auVar69 = vshufpd_avx(auVar68,auVar68,5);
            auVar68 = vminps_avx(auVar68,auVar69);
            auVar69 = vpermpd_avx2(auVar68,0x4e);
            auVar68 = vminps_avx(auVar68,auVar69);
            uVar15 = vcmpps_avx512vl(auVar88,auVar68,0);
            bVar24 = local_10c0;
            if (((byte)uVar15 & local_10c0) != 0) {
              bVar24 = (byte)uVar15 & local_10c0;
            }
LAB_01cdbbbd:
            uVar28 = 0;
            for (uVar29 = (uint)bVar24; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
              uVar28 = uVar28 + 1;
            }
            uVar29 = *(uint *)(local_fc0 + (ulong)uVar28 * 4);
            pGVar5 = (pSVar3->geometries).items[uVar29].ptr;
            if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar25 = (ulong)(byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar25);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar25 = (ulong)(uVar28 << 2);
                uVar100 = *(undefined4 *)(local_10a0 + uVar25);
                uVar1 = *(undefined4 *)(local_1080 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1040 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1020 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_1000 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar100;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(local_1240 + uVar25);
                *(uint *)(ray + k * 4 + 0x120) = uVar29;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_01cdbfff;
              }
              uVar39 = (ulong)(uVar28 * 4);
              uVar100 = *(undefined4 *)(local_10a0 + uVar39);
              local_11e0._4_4_ = uVar100;
              local_11e0._0_4_ = uVar100;
              local_11e0._8_4_ = uVar100;
              local_11e0._12_4_ = uVar100;
              local_11d0 = *(undefined4 *)(local_1080 + uVar39);
              local_11b0 = vpbroadcastd_avx512vl();
              uVar100 = *(undefined4 *)(local_1240 + uVar39);
              local_11c0._4_4_ = uVar100;
              local_11c0._0_4_ = uVar100;
              local_11c0._8_4_ = uVar100;
              local_11c0._12_4_ = uVar100;
              uVar100 = *(undefined4 *)((long)local_1040 + uVar39);
              uVar1 = *(undefined4 *)((long)local_1020 + uVar39);
              local_1200._4_4_ = uVar1;
              local_1200._0_4_ = uVar1;
              local_1200._8_4_ = uVar1;
              local_1200._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_1000 + uVar39);
              local_11f0._4_4_ = uVar1;
              local_11f0._0_4_ = uVar1;
              local_11f0._8_4_ = uVar1;
              local_11f0._12_4_ = uVar1;
              local_1210[0] = (RTCHitN)(char)uVar100;
              local_1210[1] = (RTCHitN)(char)((uint)uVar100 >> 8);
              local_1210[2] = (RTCHitN)(char)((uint)uVar100 >> 0x10);
              local_1210[3] = (RTCHitN)(char)((uint)uVar100 >> 0x18);
              local_1210[4] = (RTCHitN)(char)uVar100;
              local_1210[5] = (RTCHitN)(char)((uint)uVar100 >> 8);
              local_1210[6] = (RTCHitN)(char)((uint)uVar100 >> 0x10);
              local_1210[7] = (RTCHitN)(char)((uint)uVar100 >> 0x18);
              local_1210[8] = (RTCHitN)(char)uVar100;
              local_1210[9] = (RTCHitN)(char)((uint)uVar100 >> 8);
              local_1210[10] = (RTCHitN)(char)((uint)uVar100 >> 0x10);
              local_1210[0xb] = (RTCHitN)(char)((uint)uVar100 >> 0x18);
              local_1210[0xc] = (RTCHitN)(char)uVar100;
              local_1210[0xd] = (RTCHitN)(char)((uint)uVar100 >> 8);
              local_1210[0xe] = (RTCHitN)(char)((uint)uVar100 >> 0x10);
              local_1210[0xf] = (RTCHitN)(char)((uint)uVar100 >> 0x18);
              uStack_11cc = local_11d0;
              uStack_11c8 = local_11d0;
              uStack_11c4 = local_11d0;
              vpcmpeqd_avx2(ZEXT1632(local_11e0),ZEXT1632(local_11e0));
              uStack_119c = context->user->instID[0];
              local_11a0 = uStack_119c;
              uStack_1198 = uStack_119c;
              uStack_1194 = uStack_119c;
              uStack_1190 = context->user->instPrimID[0];
              uStack_118c = uStack_1190;
              uStack_1188 = uStack_1190;
              uStack_1184 = uStack_1190;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar39);
              local_13a0 = local_12d0;
              local_1370.valid = (int *)local_13a0;
              local_1370.geometryUserPtr = pGVar5->userPtr;
              local_1370.context = context->user;
              local_1370.hit = local_1210;
              local_1370.N = 4;
              local_1340 = auVar95._0_32_;
              local_1300 = auVar102._0_32_;
              local_1370.ray = (RTCRayN *)ray;
              if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->intersectionFilterN)(&local_1370);
                auVar102 = ZEXT3264(local_1300);
                auVar95 = ZEXT3264(local_1340);
                auVar132 = ZEXT1664(local_1320);
                auVar131 = ZEXT1664(local_1310);
              }
              uVar39 = vptestmd_avx512vl(local_13a0,local_13a0);
              if ((uVar39 & 0xf) == 0) {
LAB_01cdbf22:
                *(int *)(ray + k * 4 + 0x80) = auVar102._0_4_;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var8)(&local_1370);
                  auVar102 = ZEXT3264(local_1300);
                  auVar95 = ZEXT3264(local_1340);
                  auVar132 = ZEXT1664(local_1320);
                  auVar131 = ZEXT1664(local_1310);
                }
                uVar39 = vptestmd_avx512vl(local_13a0,local_13a0);
                uVar39 = uVar39 & 0xf;
                bVar24 = (byte)uVar39;
                if (bVar24 == 0) goto LAB_01cdbf22;
                iVar32 = *(int *)(local_1370.hit + 4);
                iVar21 = *(int *)(local_1370.hit + 8);
                iVar22 = *(int *)(local_1370.hit + 0xc);
                bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar11 = SUB81(uVar39 >> 3,0);
                *(uint *)(local_1370.ray + 0xc0) =
                     (uint)(bVar24 & 1) * *(int *)local_1370.hit |
                     (uint)!(bool)(bVar24 & 1) * *(int *)(local_1370.ray + 0xc0);
                *(uint *)(local_1370.ray + 0xc4) =
                     (uint)bVar9 * iVar32 | (uint)!bVar9 * *(int *)(local_1370.ray + 0xc4);
                *(uint *)(local_1370.ray + 200) =
                     (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1370.ray + 200);
                *(uint *)(local_1370.ray + 0xcc) =
                     (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xcc);
                iVar32 = *(int *)(local_1370.hit + 0x14);
                iVar21 = *(int *)(local_1370.hit + 0x18);
                iVar22 = *(int *)(local_1370.hit + 0x1c);
                bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar11 = SUB81(uVar39 >> 3,0);
                *(uint *)(local_1370.ray + 0xd0) =
                     (uint)(bVar24 & 1) * *(int *)(local_1370.hit + 0x10) |
                     (uint)!(bool)(bVar24 & 1) * *(int *)(local_1370.ray + 0xd0);
                *(uint *)(local_1370.ray + 0xd4) =
                     (uint)bVar9 * iVar32 | (uint)!bVar9 * *(int *)(local_1370.ray + 0xd4);
                *(uint *)(local_1370.ray + 0xd8) =
                     (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1370.ray + 0xd8);
                *(uint *)(local_1370.ray + 0xdc) =
                     (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xdc);
                iVar32 = *(int *)(local_1370.hit + 0x24);
                iVar21 = *(int *)(local_1370.hit + 0x28);
                iVar22 = *(int *)(local_1370.hit + 0x2c);
                bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar11 = SUB81(uVar39 >> 3,0);
                *(uint *)(local_1370.ray + 0xe0) =
                     (uint)(bVar24 & 1) * *(int *)(local_1370.hit + 0x20) |
                     (uint)!(bool)(bVar24 & 1) * *(int *)(local_1370.ray + 0xe0);
                *(uint *)(local_1370.ray + 0xe4) =
                     (uint)bVar9 * iVar32 | (uint)!bVar9 * *(int *)(local_1370.ray + 0xe4);
                *(uint *)(local_1370.ray + 0xe8) =
                     (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1370.ray + 0xe8);
                *(uint *)(local_1370.ray + 0xec) =
                     (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xec);
                iVar32 = *(int *)(local_1370.hit + 0x34);
                iVar21 = *(int *)(local_1370.hit + 0x38);
                iVar22 = *(int *)(local_1370.hit + 0x3c);
                bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar11 = SUB81(uVar39 >> 3,0);
                *(uint *)(local_1370.ray + 0xf0) =
                     (uint)(bVar24 & 1) * *(int *)(local_1370.hit + 0x30) |
                     (uint)!(bool)(bVar24 & 1) * *(int *)(local_1370.ray + 0xf0);
                *(uint *)(local_1370.ray + 0xf4) =
                     (uint)bVar9 * iVar32 | (uint)!bVar9 * *(int *)(local_1370.ray + 0xf4);
                *(uint *)(local_1370.ray + 0xf8) =
                     (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1370.ray + 0xf8);
                *(uint *)(local_1370.ray + 0xfc) =
                     (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xfc);
                iVar32 = *(int *)(local_1370.hit + 0x44);
                iVar21 = *(int *)(local_1370.hit + 0x48);
                iVar22 = *(int *)(local_1370.hit + 0x4c);
                bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar11 = SUB81(uVar39 >> 3,0);
                *(uint *)(local_1370.ray + 0x100) =
                     (uint)(bVar24 & 1) * *(int *)(local_1370.hit + 0x40) |
                     (uint)!(bool)(bVar24 & 1) * *(int *)(local_1370.ray + 0x100);
                *(uint *)(local_1370.ray + 0x104) =
                     (uint)bVar9 * iVar32 | (uint)!bVar9 * *(int *)(local_1370.ray + 0x104);
                *(uint *)(local_1370.ray + 0x108) =
                     (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1370.ray + 0x108);
                *(uint *)(local_1370.ray + 0x10c) =
                     (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1370.ray + 0x10c);
                auVar40 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x50));
                *(undefined1 (*) [16])(local_1370.ray + 0x110) = auVar40;
                auVar40 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x60));
                *(undefined1 (*) [16])(local_1370.ray + 0x120) = auVar40;
                auVar40 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x70));
                *(undefined1 (*) [16])(local_1370.ray + 0x130) = auVar40;
                auVar40 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x80));
                *(undefined1 (*) [16])(local_1370.ray + 0x140) = auVar40;
                auVar102 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              uVar100 = auVar102._0_4_;
              auVar94._4_4_ = uVar100;
              auVar94._0_4_ = uVar100;
              auVar94._8_4_ = uVar100;
              auVar94._12_4_ = uVar100;
              auVar94._16_4_ = uVar100;
              auVar94._20_4_ = uVar100;
              auVar94._24_4_ = uVar100;
              auVar94._28_4_ = uVar100;
              uVar39 = vcmpps_avx512vl(auVar95._0_32_,auVar94,2);
              uVar25 = (byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar25) & uVar39;
            }
            bVar24 = (byte)uVar25;
            if (bVar24 == 0) goto LAB_01cdbfff;
            auVar93._8_4_ = 0x7f800000;
            auVar93._0_8_ = 0x7f8000007f800000;
            auVar93._12_4_ = 0x7f800000;
            auVar93._16_4_ = 0x7f800000;
            auVar93._20_4_ = 0x7f800000;
            auVar93._24_4_ = 0x7f800000;
            auVar93._28_4_ = 0x7f800000;
            auVar68 = vblendmps_avx512vl(auVar93,auVar95._0_32_);
            auVar89._0_4_ =
                 (uint)(bVar24 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar24 & 1) * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar89._4_4_ = (uint)bVar9 * auVar68._4_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar89._8_4_ = (uint)bVar9 * auVar68._8_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar89._12_4_ = (uint)bVar9 * auVar68._12_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar89._16_4_ = (uint)bVar9 * auVar68._16_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar89._20_4_ = (uint)bVar9 * auVar68._20_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar89._24_4_ = (uint)bVar9 * auVar68._24_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = SUB81(uVar25 >> 7,0);
            auVar89._28_4_ = (uint)bVar9 * auVar68._28_4_ | (uint)!bVar9 * 0x7f800000;
            auVar68 = vshufps_avx(auVar89,auVar89,0xb1);
            auVar68 = vminps_avx(auVar89,auVar68);
            auVar69 = vshufpd_avx(auVar68,auVar68,5);
            auVar68 = vminps_avx(auVar68,auVar69);
            auVar69 = vpermpd_avx2(auVar68,0x4e);
            auVar68 = vminps_avx(auVar68,auVar69);
            uVar15 = vcmpps_avx512vl(auVar89,auVar68,0);
            bVar27 = (byte)uVar15 & bVar24;
            if (bVar27 != 0) {
              bVar24 = bVar27;
            }
            goto LAB_01cdbbbd;
          }
        }
      }
LAB_01cdbfff:
      auVar102 = ZEXT1664(local_1250);
      auVar130 = ZEXT1664(local_12c0);
      fVar103 = local_1260;
      fVar105 = fStack_125c;
      fVar106 = fStack_1258;
      fVar107 = fStack_1254;
      fVar108 = local_1270;
      fVar109 = fStack_126c;
      fVar110 = fStack_1268;
      fVar111 = fStack_1264;
      fVar112 = local_1280;
      fVar113 = fStack_127c;
      fVar114 = fStack_1278;
      fVar115 = fStack_1274;
      fVar116 = local_1290;
      fVar118 = fStack_128c;
      fVar119 = fStack_1288;
      fVar120 = fStack_1284;
      fVar121 = local_12a0;
      fVar123 = fStack_129c;
      fVar124 = fStack_1298;
      fVar125 = fStack_1294;
      fVar126 = local_12b0;
      fVar127 = fStack_12ac;
      fVar128 = fStack_12a8;
      fVar129 = fStack_12a4;
    }
    uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar95 = ZEXT1664(CONCAT412(uVar100,CONCAT48(uVar100,CONCAT44(uVar100,uVar100))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }